

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::
SimpleTransformPromiseNode<kj::Maybe<capnp::MessageReaderAndFds>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compat/websocket-rpc-test.c++:48:11)>
::getImpl(SimpleTransformPromiseNode<kj::Maybe<capnp::MessageReaderAndFds>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compat_websocket_rpc_test_c__:48:11)>
          *this,ExceptionOrValue *output)

{
  Exception *exception;
  ExceptionOr<kj::Promise<void>_> *pEVar1;
  Maybe<capnp::MessageReaderAndFds> *in;
  Promise<void> local_568;
  ExceptionOr<kj::Promise<void>_> local_560;
  Maybe<capnp::MessageReaderAndFds> *local_3b8;
  Maybe<capnp::MessageReaderAndFds> *depValue;
  Maybe<capnp::MessageReaderAndFds> *_depValue779;
  Exception *local_200;
  Exception *depException;
  Exception *_depException777;
  undefined1 local_1e0 [8];
  ExceptionOr<kj::Maybe<capnp::MessageReaderAndFds>_> depResult;
  ExceptionOrValue *output_local;
  SimpleTransformPromiseNode<kj::Maybe<capnp::MessageReaderAndFds>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compat_websocket_rpc_test_c__:48:11)>
  *this_local;
  
  depResult.value.ptr.field_1._32_8_ = output;
  ExceptionOr<kj::Maybe<capnp::MessageReaderAndFds>_>::ExceptionOr
            ((ExceptionOr<kj::Maybe<capnp::MessageReaderAndFds>_> *)local_1e0);
  TransformPromiseNodeBase::getDepResult
            (&this->super_TransformPromiseNodeBase,(ExceptionOrValue *)local_1e0);
  depException = readMaybe<kj::Exception>((Maybe<kj::Exception> *)local_1e0);
  if (depException == (Exception *)0x0) {
    depValue = readMaybe<kj::Maybe<capnp::MessageReaderAndFds>>
                         ((Maybe<kj::Maybe<capnp::MessageReaderAndFds>_> *)
                          ((long)&depResult.super_ExceptionOrValue.exception.ptr.field_1.value.
                                  details.builder + 0x18));
    if (depValue != (Maybe<capnp::MessageReaderAndFds> *)0x0) {
      local_3b8 = depValue;
      in = mv<kj::Maybe<capnp::MessageReaderAndFds>>(depValue);
      MaybeVoidCaller<kj::Maybe<capnp::MessageReaderAndFds>,kj::Promise<void>>::
      apply<TestCase27::run()::__0>
                ((MaybeVoidCaller<kj::Maybe<capnp::MessageReaderAndFds>,kj::Promise<void>> *)
                 &local_568,&this->func,in);
      TransformPromiseNodeBase::handle<kj::Promise<void>>
                (&local_560,&this->super_TransformPromiseNodeBase,&local_568);
      pEVar1 = ExceptionOrValue::as<kj::Promise<void>>
                         ((ExceptionOrValue *)depResult.value.ptr.field_1._32_8_);
      ExceptionOr<kj::Promise<void>_>::operator=(pEVar1,&local_560);
      ExceptionOr<kj::Promise<void>_>::~ExceptionOr(&local_560);
      Promise<void>::~Promise(&local_568);
    }
  }
  else {
    local_200 = depException;
    exception = mv<kj::Exception>(depException);
    ExceptionOr<kj::Promise<void>_>::ExceptionOr
              ((ExceptionOr<kj::Promise<void>_> *)&_depValue779,false,exception);
    pEVar1 = ExceptionOrValue::as<kj::Promise<void>>
                       ((ExceptionOrValue *)depResult.value.ptr.field_1._32_8_);
    ExceptionOr<kj::Promise<void>_>::operator=
              (pEVar1,(ExceptionOr<kj::Promise<void>_> *)&_depValue779);
    ExceptionOr<kj::Promise<void>_>::~ExceptionOr((ExceptionOr<kj::Promise<void>_> *)&_depValue779);
  }
  ExceptionOr<kj::Maybe<capnp::MessageReaderAndFds>_>::~ExceptionOr
            ((ExceptionOr<kj::Maybe<capnp::MessageReaderAndFds>_> *)local_1e0);
  return;
}

Assistant:

void getImpl(ExceptionOrValue& output) override {
    typedef _::FixVoid<_::ReturnType<Func, _DepT>> T;
    typedef _::FixVoid<_DepT> DepT;
    ExceptionOr<DepT> depResult;
    getDepResult(depResult);
    KJ_IF_SOME(depException, depResult.exception) {
      output.as<T>() = ExceptionOr<T>(false, kj::mv(depException));
    } else KJ_IF_SOME(depValue, depResult.value) {
      output.as<T>() = handle(MaybeVoidCaller<DepT, T>::apply(func, kj::mv(depValue)));
    }
  }